

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void V_SetRndCmp(Vector *V)

{
  Real *pRVar1;
  LASErrIdType LVar2;
  int iVar3;
  Real *pRVar4;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  Vector *V_local;
  
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    pRVar4 = (Real *)V_GetDim(V);
    pRVar1 = V->Cmp;
    for (VCmp = (Real *)0x1; VCmp <= pRVar4; VCmp = (Real *)((long)VCmp + 1)) {
      iVar3 = rand();
      pRVar1[(long)VCmp] = (double)iVar3 / 2147483648.0;
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetRndCmp(Vector *V)
/* set random components of the vector V */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V_GetDim(V);
        VCmp = V->Cmp;
        for (Ind = 1; Ind <= Dim; Ind++) {
            VCmp[Ind] = (double)rand() / ((double)RAND_MAX + 1.0);
        }
        V->Multipl = 1.0;
    }
}